

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

half __thiscall
Imf_3_2::DwaCompressor::LossyDctEncoderBase::quantize
          (LossyDctEncoderBase *this,half src,float errorTolerance)

{
  ushort uVar1;
  int iVar2;
  ushort *puVar3;
  
  iVar2 = (uint)countSetBits::numBitsSet[(byte)(src._h >> 8)] +
          (uint)countSetBits::numBitsSet[src._h & 0xff];
  puVar3 = (ushort *)(&closestData + (ulong)*(uint *)(closestDataOffset + (ulong)src._h * 4) * 2);
  do {
    if (iVar2 < 1) {
      return (half)src._h;
    }
    iVar2 = iVar2 + -1;
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
  } while (errorTolerance <=
           ABS(*(float *)(_imath_half_to_float_table + (ulong)uVar1 * 4) -
               *(float *)(_imath_half_to_float_table + (ulong)src._h * 4)));
  return (half)uVar1;
}

Assistant:

half
DwaCompressor::LossyDctEncoderBase::quantize (half src, float errorTolerance)
{
    half                  tmp;
    float                 srcFloat   = (float) src;
    int                   numSetBits = countSetBits (src.bits ());
    const unsigned short* closest =
        closestData + closestDataOffset[src.bits ()];

    for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp.setBits (*closest);

        if (fabs ((float) tmp - srcFloat) < errorTolerance) return tmp;

        closest++;
    }

    return src;
}